

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O2

char * whisper_bench_memcpy_str(int n_threads)

{
  int iVar1;
  int iVar2;
  size_t i;
  ulong uVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  size_t i_6;
  size_t sVar9;
  int32_t th;
  size_t i_3;
  long lVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  uint local_1d4;
  double local_1d0;
  double local_1c8;
  size_t size;
  int local_1b4;
  char *dst;
  char *src;
  long *local_1a0;
  size_t n;
  thread local_190;
  type helper;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  char strbuf [256];
  
  if (whisper_bench_memcpy_str::s_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&whisper_bench_memcpy_str::s_abi_cxx11_);
    if (iVar1 != 0) {
      whisper_bench_memcpy_str::s_abi_cxx11_._M_dataplus._M_p =
           (pointer)&whisper_bench_memcpy_str::s_abi_cxx11_.field_2;
      whisper_bench_memcpy_str::s_abi_cxx11_._M_string_length = 0;
      whisper_bench_memcpy_str::s_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,&whisper_bench_memcpy_str::s_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&whisper_bench_memcpy_str::s_abi_cxx11_);
    }
  }
  std::__cxx11::string::assign((char *)&whisper_bench_memcpy_str::s_abi_cxx11_);
  ggml_time_init();
  iVar1 = 0x400;
  if (n_threads < 1) {
    iVar1 = n_threads;
  }
  auVar12._8_4_ = iVar1 >> 0x1f;
  auVar12._0_8_ = (long)iVar1;
  auVar12._12_4_ = 0x45300000;
  dVar14 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0)) * 1000000.0;
  n = 0x14;
  uVar3 = (ulong)dVar14;
  uVar3 = (long)(dVar14 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
  size = uVar3;
  local_1b4 = n_threads;
  pvVar4 = malloc(uVar3);
  pvVar5 = malloc(uVar3);
  for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    *(char *)((long)pvVar4 + uVar6) = (char)uVar6;
  }
  memcpy(pvVar5,pvVar4,uVar3);
  local_1d0 = 0.0;
  lVar10 = 0x14;
  while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
    lVar7 = ggml_time_us();
    memcpy(pvVar5,pvVar4,uVar3);
    lVar8 = ggml_time_us();
    local_1d0 = local_1d0 + (double)(lVar8 - lVar7) * 1e-06;
    iVar1 = rand();
    iVar2 = rand();
    *(char *)((long)pvVar4 + (ulong)(long)iVar2 % uVar3) = (char)iVar1;
  }
  lVar10 = uVar3 * 0x14;
  auVar13._8_4_ = (int)((ulong)lVar10 >> 0x20);
  auVar13._0_8_ = lVar10;
  auVar13._12_4_ = 0x45300000;
  dVar14 = (auVar13._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0);
  snprintf(strbuf,0x100,"memcpy: %7.2f GB/s (heat-up)\n",dVar14 / (local_1d0 * 1000000000.0));
  std::__cxx11::string::append((char *)&whisper_bench_memcpy_str::s_abi_cxx11_);
  local_1d0 = 0.0;
  for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    local_1d0 = local_1d0 + (double)(int)*(char *)((long)pvVar5 + uVar6);
  }
  free(pvVar4);
  free(pvVar5);
  pvVar4 = malloc(uVar3);
  pvVar5 = malloc(uVar3);
  for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    *(char *)((long)pvVar4 + uVar6) = (char)uVar6;
  }
  memcpy(pvVar5,pvVar4,uVar3);
  local_1c8 = 0.0;
  for (uVar6 = 0; uVar6 < 0x14; uVar6 = uVar6 + 1) {
    lVar10 = ggml_time_us();
    memcpy(pvVar5,pvVar4,uVar3);
    lVar7 = ggml_time_us();
    local_1c8 = local_1c8 + (double)(lVar7 - lVar10) * 1e-06;
    iVar1 = rand();
    iVar2 = rand();
    *(char *)((long)pvVar4 + (ulong)(long)iVar2 % uVar3) = (char)iVar1;
  }
  snprintf(strbuf,0x100,"memcpy: %7.2f GB/s ( 1 thread)\n",dVar14 / (local_1c8 * 1000000000.0));
  std::__cxx11::string::append((char *)&whisper_bench_memcpy_str::s_abi_cxx11_);
  for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    local_1d0 = local_1d0 + (double)(int)*(char *)((long)pvVar5 + uVar6);
  }
  free(pvVar4);
  free(pvVar5);
  local_1d4 = 1;
  iVar1 = local_1b4;
  while( true ) {
    sVar9 = size;
    if (iVar1 < (int)local_1d4) break;
    src = (char *)malloc(size);
    dst = (char *)malloc(sVar9);
    for (uVar3 = 0; uVar3 < sVar9; uVar3 = uVar3 + 1) {
      src[uVar3] = (char)uVar3;
      sVar9 = size;
    }
    memcpy(dst,src,sVar9);
    helper.size = &size;
    helper.k = (int32_t *)&local_1d4;
    helper.n = &n;
    helper.dst = &dst;
    helper.src = &src;
    local_1c8 = (double)ggml_time_us();
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              (&threads,(long)(int)local_1d4 - 1,(allocator_type *)&local_1a0);
    lVar7 = 0;
    for (lVar10 = 0; lVar10 < (long)(int)local_1d4 + -1; lVar10 = lVar10 + 1) {
      local_190._M_id._M_thread = (id)0;
      local_1a0 = (long *)operator_new(0x38);
      *local_1a0 = (long)&PTR___State_001857b0;
      *(int *)(local_1a0 + 1) = (int)lVar10;
      local_1a0[2] = (long)helper.size;
      local_1a0[3] = (long)helper.k;
      local_1a0[4] = (long)helper.n;
      local_1a0[5] = (long)helper.dst;
      local_1a0[6] = (long)helper.src;
      std::thread::_M_start_thread(&local_190,(allocator_type *)&local_1a0,0);
      if (local_1a0 != (long *)0x0) {
        (**(code **)(*local_1a0 + 8))();
      }
      std::thread::operator=
                ((thread *)
                 ((long)&((threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_start)->_M_id)._M_thread + lVar7),
                 &local_190);
      std::thread::~thread(&local_190);
      lVar7 = lVar7 + 8;
    }
    std::
    tuple_element<0UL,_std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/src/whisper.cpp:6727:23),_int>_>
    ::type::operator()(&helper,(int)((long)(int)local_1d4 + -1));
    for (lVar10 = 0; lVar10 < (long)(int)local_1d4 + -1; lVar10 = lVar10 + 1) {
      std::thread::join();
    }
    lVar10 = ggml_time_us();
    lVar7 = size * n;
    auVar15._8_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar15._0_8_ = lVar7;
    auVar15._12_4_ = 0x45300000;
    snprintf(strbuf,0x100,"memcpy: %7.2f GB/s (%2d thread)\n",
             ((auVar15._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) /
             (((double)(lVar10 - (long)local_1c8) * 1e-06 + 0.0) * 1000000000.0),(ulong)local_1d4);
    std::__cxx11::string::append((char *)&whisper_bench_memcpy_str::s_abi_cxx11_);
    iVar1 = local_1b4;
    for (sVar9 = 0; size != sVar9; sVar9 = sVar9 + 1) {
      local_1d0 = local_1d0 + (double)(int)dst[sVar9];
    }
    free(src);
    free(dst);
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
    local_1d4 = local_1d4 + 1;
  }
  snprintf(strbuf,0x100,"sum:    %f\n",local_1d0);
  std::__cxx11::string::append((char *)&whisper_bench_memcpy_str::s_abi_cxx11_);
  return whisper_bench_memcpy_str::s_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

WHISPER_API const char * whisper_bench_memcpy_str(int n_threads) {
    static std::string s;
    s = "";
    char strbuf[256];

    ggml_time_init();

    size_t n    = 20;
    size_t arr  = n_threads > 0 ? 1024llu : n_threads; // trick to avoid compiler optimizations

    // 1GB array
    const size_t size = arr*1e6;

    double sum  = 0.0;

    // heat-up
    {
        char * src = (char *) malloc(size);
        char * dst = (char *) malloc(size);

        for (size_t i = 0; i < size; i++) src[i] = i;

        memcpy(dst, src, size); // heat-up

        double tsum = 0.0;

        for (size_t i = 0; i < n; i++) {
            const int64_t t0 = ggml_time_us();

            memcpy(dst, src, size);

            const int64_t t1 = ggml_time_us();

            tsum += (t1 - t0)*1e-6;

            src[rand() % size] = rand() % 256;
        }

        snprintf(strbuf, sizeof(strbuf), "memcpy: %7.2f GB/s (heat-up)\n", (double) (n*size)/(tsum*1e9));
        s += strbuf;

        // needed to prevent the compiler from optimizing the memcpy away
        {
            for (size_t i = 0; i < size; i++) sum += dst[i];
        }

        free(src);
        free(dst);
    }

    // single-thread
    {
        char * src = (char *) malloc(size);
        char * dst = (char *) malloc(size);

        for (size_t i = 0; i < size; i++) src[i] = i;

        memcpy(dst, src, size); // heat-up

        double tsum = 0.0;

        for (size_t i = 0; i < n; i++) {
            const int64_t t0 = ggml_time_us();

            memcpy(dst, src, size);

            const int64_t t1 = ggml_time_us();

            tsum += (t1 - t0)*1e-6;

            src[rand() % size] = rand() % 256;
        }

        snprintf(strbuf, sizeof(strbuf), "memcpy: %7.2f GB/s ( 1 thread)\n", (double) (n*size)/(tsum*1e9));
        s += strbuf;

        // needed to prevent the compiler from optimizing the memcpy away
        {
            for (size_t i = 0; i < size; i++) sum += dst[i];
        }

        free(src);
        free(dst);
    }

    // multi-thread

    for (int32_t k = 1; k <= n_threads; k++) {
        char * src = (char *) malloc(size);
        char * dst = (char *) malloc(size);

        for (size_t i = 0; i < size; i++) src[i] = i;

        memcpy(dst, src, size); // heat-up

        double tsum = 0.0;

        auto helper = [&](int th) {
            const int64_t i0 = (th + 0)*size/k;
            const int64_t i1 = (th + 1)*size/k;

            for (size_t i = 0; i < n; i++) {
                memcpy(dst + i0, src + i0, i1 - i0);

                src[i0 + rand() % (i1 - i0)] = rand() % 256;
            };
        };

        const int64_t t0 = ggml_time_us();

        std::vector<std::thread> threads(k - 1);
        for (int32_t th = 0; th < k - 1; ++th) {
            threads[th] = std::thread(helper, th);
        }

        helper(k - 1);

        for (int32_t th = 0; th < k - 1; ++th) {
            threads[th].join();
        }

        const int64_t t1 = ggml_time_us();

        tsum += (t1 - t0)*1e-6;

        snprintf(strbuf, sizeof(strbuf), "memcpy: %7.2f GB/s (%2d thread)\n", (double) (n*size)/(tsum*1e9), k);
        s += strbuf;

        // needed to prevent the compiler from optimizing the memcpy away
        {
            for (size_t i = 0; i < size; i++) sum += dst[i];
        }

        free(src);
        free(dst);
    }

    snprintf(strbuf, sizeof(strbuf), "sum:    %f\n", sum);
    s += strbuf;

    return s.c_str();
}